

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Float pbrt::AngleBetween<float>(Vector3<float> *v1,Vector3<float> *v2)

{
  undefined1 auVar1 [16];
  float fVar2;
  type tVar3;
  undefined1 extraout_var_00 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector3<float> VVar8;
  Tuple3<pbrt::Vector3,_float> local_20;
  undefined1 extraout_var [60];
  undefined1 auVar7 [56];
  
  fVar2 = Dot<float>(v1,v2);
  if (0.0 <= fVar2) {
    auVar7 = extraout_var_00;
    VVar8 = Tuple3<pbrt::Vector3,float>::operator-(&v2->super_Tuple3<pbrt::Vector3,_float>,v1);
    local_20.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    local_20._0_8_ = vmovlps_avx(auVar6._0_16_);
    tVar3 = Length<float>((Vector3<float> *)&local_20);
    fVar2 = SafeASin(tVar3 * 0.5);
    fVar2 = fVar2 + fVar2;
  }
  else {
    auVar7 = extraout_var_00;
    VVar8 = Tuple3<pbrt::Vector3,float>::operator+(&v1->super_Tuple3<pbrt::Vector3,_float>,v2);
    local_20.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar7;
    local_20._0_8_ = vmovlps_avx(auVar4._0_16_);
    tVar3 = Length<float>((Vector3<float> *)&local_20);
    auVar5._0_4_ = SafeASin(tVar3 * 0.5);
    auVar5._4_60_ = extraout_var;
    auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar5._0_16_,ZEXT416(0x40490fdb));
    fVar2 = auVar1._0_4_;
  }
  return fVar2;
}

Assistant:

PBRT_CPU_GPU inline Float AngleBetween(const Vector3<T> &v1, const Vector3<T> &v2) {
    if (Dot(v1, v2) < 0)
        return Pi - 2 * SafeASin(Length(v1 + v2) / 2);
    else
        return 2 * SafeASin(Length(v2 - v1) / 2);
}